

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_NetworkAdapter.cpp
# Opt level: O3

char * axl::io::getNetworkAdapterFlagString(NetworkAdapterFlag flag)

{
  byte bVar1;
  char *pcVar2;
  
  bVar1 = sl::getLoBitIdx32(flag);
  if (bVar1 < 6) {
    pcVar2 = getNetworkAdapterFlagString::stringTable[bVar1];
  }
  else {
    pcVar2 = "undefined-adapter-flag";
  }
  return pcVar2;
}

Assistant:

const char*
getNetworkAdapterFlagString(NetworkAdapterFlag flag) {
	static const char* stringTable[] = {
		"DHCP",      // NetworkAdapterFlag_Dhcp      = 0x01,
		"DDNS",      // NetworkAdapterFlag_Ddns      = 0x02,
		"broadcast", // NetworkAdapterFlag_Broadcast = 0x04,
		"multicast", // NetworkAdapterFlag_Multicast = 0x08,
		"IPv4",      // NetworkAdapterFlag_Ip4       = 0x10,
		"IPv6",      // NetworkAdapterFlag_Ip6       = 0x20,
	};

	size_t i = sl::getLoBitIdx32(flag);
	return i < countof(stringTable) ?
		stringTable[i] :
		"undefined-adapter-flag";
}